

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

void __thiscall
S2Polyline::Init(S2Polyline *this,vector<S2LatLng,_std::allocator<S2LatLng>_> *vertices)

{
  VType *pVVar1;
  Vector3<double> *pVVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  ulong uVar6;
  pointer __p;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int i;
  long lVar10;
  long lVar11;
  S2Point local_48;
  
  uVar7 = (long)(vertices->super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vertices->super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar5 = (int)(uVar7 >> 4);
  this->num_vertices_ = iVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
    uVar9 = uVar6;
  }
  __p = (pointer)operator_new__(uVar9);
  if ((uVar7 & 0xfffffffff) != 0) {
    uVar6 = uVar6 - 0x18;
    memset(__p,0,(uVar6 - uVar6 % 0x18) + 0x18);
  }
  std::__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>::reset
            ((__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_> *)
             &this->vertices_,__p);
  lVar11 = 0;
  lVar8 = 0;
  for (lVar10 = 0; lVar10 < this->num_vertices_; lVar10 = lVar10 + 1) {
    S2LatLng::ToPoint(&local_48,
                      (S2LatLng *)
                      ((long)(((vertices->super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>).
                               _M_impl.super__Vector_impl_data._M_start)->coords_).c_ + lVar8));
    pVVar2 = (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
    *(VType *)((long)pVVar2->c_ + lVar11 + 0x10) = local_48.c_[2];
    pVVar1 = (VType *)((long)pVVar2->c_ + lVar11);
    *pVVar1 = local_48.c_[0];
    pVVar1[1] = local_48.c_[1];
    lVar8 = lVar8 + 0x10;
    lVar11 = lVar11 + 0x18;
  }
  if ((FLAGS_s2debug == true) && (this->s2debug_override_ == ALLOW)) {
    bVar4 = IsValid(this);
    if (!bVar4) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
                 ,0x71,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_48.c_[1],"Check failed: IsValid() ");
      abort();
    }
  }
  return;
}

Assistant:

void S2Polyline::Init(const vector<S2LatLng>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  for (int i = 0; i < num_vertices_; ++i) {
    vertices_[i] = vertices[i].ToPoint();
  }
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    S2_CHECK(IsValid());
  }
}